

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

int identify_regions(FIRSTPASS_STATS *stats_start,int total_frames,int offset,REGIONS *regions,
                    int *total_regions)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  REGIONS *regions_00;
  int *num_regions_00;
  double dVar7;
  int iVar8;
  REGIONS *regions_01;
  double *pdVar9;
  double *pdVar10;
  REGION_TYPES *pRVar11;
  int iVar12;
  ulong uVar13;
  REGIONS *pRVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  int iVar22;
  ulong uVar23;
  double *pdVar24;
  int iVar25;
  REGION_TYPES RVar26;
  long lVar27;
  int64_t *piVar28;
  int j;
  long lVar29;
  uint uVar30;
  long lVar31;
  bool bVar32;
  bool bVar33;
  double total_wt;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  int num_regions;
  uint local_c4;
  ulong local_c0;
  ulong local_b8;
  int64_t *local_b0;
  int local_a8;
  int local_a4;
  REGIONS *local_a0;
  double *local_98;
  int local_90;
  int local_8c;
  double *local_88;
  int *local_80;
  double *local_78;
  double *local_70;
  int local_64;
  double *local_60;
  double *local_58;
  int64_t *local_50;
  REGION_TYPES *local_48;
  double *local_40;
  double *local_38;
  
  local_b8 = CONCAT44(in_register_00000034,total_frames);
  iVar8 = 0;
  if (1 < total_frames) {
    uVar13 = (ulong)(uint)total_frames;
    local_b0 = (int64_t *)(uVar13 * 0x38);
    local_a0 = regions;
    local_80 = total_regions;
    local_64 = offset;
    regions_01 = (REGIONS *)aom_malloc((size_t)local_b0);
    pdVar9 = (double *)aom_calloc(uVar13,8);
    pdVar10 = (double *)aom_calloc(uVar13,8);
    local_88 = (double *)aom_calloc(uVar13,8);
    auVar36._0_4_ = -(uint)((int)regions_01 == 0 && (int)((ulong)regions_01 >> 0x20) == 0);
    auVar36._4_4_ = -(uint)((int)pdVar9 == 0 && (int)((ulong)pdVar9 >> 0x20) == 0);
    auVar36._8_4_ = -(uint)((int)pdVar10 == 0 && (int)((ulong)pdVar10 >> 0x20) == 0);
    auVar36._12_4_ = -(uint)((int)local_88 == 0 && (int)((ulong)local_88 >> 0x20) == 0);
    iVar8 = movmskps((int)local_88,auVar36);
    if (iVar8 == 0) {
      memset(regions_01,0,(size_t)local_b0);
      local_b8 = (ulong)((int)local_b8 - 1);
      local_b0 = &stats_start[-1].is_flash;
      local_78 = &stats_start[-1].intra_error;
      local_48 = &regions_01[-1].type;
      local_38 = &regions_01[-1].avg_cor_coeff;
      local_60 = &stats_start->coded_error;
      local_58 = &stats_start->intra_error;
      local_40 = &stats_start[1].intra_error;
      local_50 = &stats_start->is_flash;
      uVar30 = 0;
      local_a8 = 0;
      local_98 = pdVar10;
      local_70 = pdVar9;
      do {
        uVar13 = (ulong)uVar30;
        local_c0 = 0xffffffffffffffff;
        uVar18 = (uint)local_b8;
        if (uVar18 != uVar30) {
          uVar15 = uVar30 - 3;
          local_c0 = uVar13;
          uVar19 = uVar30;
          while( true ) {
            uVar19 = uVar19 + 1;
            lVar29 = (long)(int)uVar15;
            if ((long)(int)uVar15 < (long)(int)uVar30) {
              lVar29 = (long)(int)uVar30;
            }
            uVar16 = uVar15;
            if ((int)uVar15 < (int)uVar30) {
              uVar16 = uVar30;
            }
            if (local_b8 < local_c0) break;
            uVar23 = local_c0 + 1;
            if ((stats_start[local_c0].is_flash == 0) &&
               ((local_c0 == 0 || (local_b0[local_c0 * 0x1d] == 0)))) {
              pdVar10 = local_60 + (long)(int)uVar19 * 0x1d;
              piVar28 = local_b0 + lVar29 * 0x1d;
              lVar31 = (long)(int)uVar23;
              lVar29 = (long)(int)uVar16;
              dVar43 = stats_start[local_c0].intra_error;
              dVar38 = stats_start[local_c0].coded_error;
              auVar40 = ZEXT816(0);
              auVar41 = ZEXT816(0);
              while( true ) {
                dVar37 = auVar40._0_8_;
                dVar34 = auVar41._0_8_;
                if ((long)local_c0 <= lVar29) break;
                if ((piVar28[0x1d] == 0) && ((lVar29 < 1 || (*piVar28 == 0)))) {
                  dVar45 = (double)piVar28[7];
                  dVar46 = (double)piVar28[9];
                  if (dVar45 <= 0.01) {
                    dVar45 = 0.01;
                  }
                  dVar44 = dVar46 / dVar45;
                  if (dVar46 / dVar45 <= dVar34) {
                    dVar44 = dVar34;
                  }
                  if (dVar46 <= dVar37) {
                    dVar46 = dVar37;
                  }
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = dVar46;
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = dVar44;
                }
                lVar29 = lVar29 + 1;
                piVar28 = piVar28 + 0x1d;
              }
              if (dVar43 <= 0.01) {
                dVar43 = 0.01;
              }
              uVar16 = (int)local_c0 + 3;
              if ((int)uVar18 <= (int)uVar16) {
                uVar16 = uVar18;
              }
              dVar46 = 0.0;
              dVar45 = 0.0;
              for (; lVar31 <= (int)uVar16; lVar31 = lVar31 + 1) {
                if ((local_c0 == 0) || (dVar44 = dVar45, local_b0[local_c0 * 0x1d] == 0)) {
                  dVar47 = pdVar10[-2];
                  dVar44 = *pdVar10;
                  if (dVar47 <= 0.01) {
                    dVar47 = 0.01;
                  }
                  dVar7 = dVar44 / dVar47;
                  if (dVar44 / dVar47 <= dVar46) {
                    dVar7 = dVar46;
                  }
                  dVar46 = dVar7;
                  if (dVar44 <= dVar45) {
                    dVar44 = dVar45;
                  }
                }
                pdVar10 = pdVar10 + 0x1d;
                dVar45 = dVar44;
              }
              pdVar10 = local_98;
              pdVar9 = local_70;
              if ((0.001 <= dVar34) || (0.001 <= dVar46)) {
                dVar44 = stats_start[local_c0].sr_coded_error;
                if ((local_c0 < local_b8) && (dVar44 <= stats_start[uVar23].sr_coded_error)) {
                  dVar44 = stats_start[uVar23].sr_coded_error;
                }
                dVar47 = dVar38;
                if (dVar38 <= 0.01) {
                  dVar47 = 0.01;
                }
                if (dVar44 / dVar47 <= 1.2) {
                  if (dVar34 <= dVar46) {
                    dVar34 = dVar46;
                  }
                  if (dVar34 + dVar34 <= dVar38 / dVar43) goto LAB_001e42ab;
                  if (dVar37 <= dVar45) {
                    dVar37 = dVar45;
                  }
                  if (dVar37 + dVar37 <= dVar38) goto LAB_001e42ab;
                }
              }
              else if (0.02 <= dVar38 / dVar43) goto LAB_001e42ab;
            }
            uVar15 = uVar15 + 1;
            local_c0 = uVar23;
          }
          local_c0 = 0xffffffffffffffff;
        }
LAB_001e42ab:
        uVar15 = (int)local_c0 - 1;
        if ((int)local_c0 < 0) {
          uVar15 = uVar18;
        }
        lVar29 = (long)(int)uVar15;
        uVar18 = uVar30 - 3;
        uVar19 = uVar18;
        for (uVar23 = uVar13; uVar20 = uVar13, (long)uVar23 <= lVar29; uVar23 = uVar23 + 1) {
          dVar43 = 0.0;
          uVar16 = uVar19;
          for (lVar31 = 0; lVar31 != 0x38; lVar31 = lVar31 + 8) {
            uVar17 = uVar30;
            if ((int)uVar30 < (int)uVar16) {
              uVar17 = uVar16;
            }
            if ((int)uVar15 <= (int)uVar17) {
              uVar17 = uVar15;
            }
            if (stats_start[(int)uVar17].is_flash == 0) {
              dVar38 = *(double *)((long)&smooth_filter_stats_smooth_filt + lVar31);
              pdVar9[uVar23] = stats_start[(int)uVar17].intra_error * dVar38 + pdVar9[uVar23];
              dVar43 = dVar43 + dVar38;
            }
            uVar16 = uVar16 + 1;
          }
          if (dVar43 <= 0.01) {
            dVar43 = stats_start[uVar23].intra_error;
          }
          else {
            dVar43 = pdVar9[uVar23] / dVar43;
          }
          pdVar9[uVar23] = dVar43;
          uVar19 = uVar19 + 1;
        }
        for (; (long)uVar20 <= lVar29; uVar20 = uVar20 + 1) {
          dVar43 = 0.0;
          uVar19 = uVar18;
          for (lVar31 = 0; lVar31 != 0x38; lVar31 = lVar31 + 8) {
            uVar16 = uVar30;
            if ((int)uVar30 < (int)uVar19) {
              uVar16 = uVar19;
            }
            if ((int)uVar15 <= (int)uVar16) {
              uVar16 = uVar15;
            }
            if ((stats_start[(int)uVar16].is_flash == 0) &&
               (((int)uVar16 < 1 || (local_b0[(ulong)uVar16 * 0x1d] == 0)))) {
              dVar38 = *(double *)((long)&smooth_filter_stats_smooth_filt + lVar31);
              pdVar10[uVar20] = stats_start[(int)uVar16].coded_error * dVar38 + pdVar10[uVar20];
              dVar43 = dVar43 + dVar38;
            }
            uVar19 = uVar19 + 1;
          }
          if (dVar43 <= 0.01) {
            dVar43 = stats_start[uVar20].coded_error;
          }
          else {
            dVar43 = pdVar10[uVar20] / dVar43;
          }
          pdVar10[uVar20] = dVar43;
          uVar18 = uVar18 + 1;
        }
        uVar23 = uVar13;
        if (uVar30 == uVar15) {
          local_88[uVar13] = 0.0;
        }
        else {
          while ((long)uVar23 <= lVar29) {
            uVar18 = (int)uVar23 - 1;
            if ((int)uVar18 <= (int)uVar30) {
              uVar18 = uVar30;
            }
            uVar16 = (uint)(uVar23 + 1);
            uVar19 = uVar15;
            if ((int)uVar16 < (int)uVar15) {
              uVar19 = uVar16;
            }
            local_88[uVar23] =
                 (pdVar10[(int)uVar19] - pdVar10[(int)uVar18]) / (double)(int)(uVar19 - uVar18);
            uVar23 = uVar23 + 1;
          }
        }
        regions_01->start = uVar30;
        iVar8 = 0;
        for (; (long)uVar13 <= lVar29; uVar13 = uVar13 + 1) {
          iVar22 = 0;
          auVar39._8_8_ = 0x3f50624dd2f1a9fc;
          auVar39._0_8_ = 0x3f50624dd2f1a9fc;
          auVar35._8_8_ = 0x3f50624dd2f1a9fc;
          auVar35._0_8_ = 0x3f50624dd2f1a9fc;
          for (iVar25 = -3; iVar12 = (int)uVar13, iVar25 != 4; iVar25 = iVar25 + 1) {
            uVar18 = iVar12 + iVar25;
            if (iVar12 + iVar25 <= (int)uVar30) {
              uVar18 = uVar30;
            }
            if ((int)uVar15 <= (int)uVar18) {
              uVar18 = uVar15;
            }
            if ((stats_start[(int)uVar18].is_flash == 0) &&
               (((int)uVar18 < 1 || (local_b0[(ulong)uVar18 * 0x1d] == 0)))) {
              dVar34 = auVar35._0_8_;
              dVar43 = stats_start[(int)uVar18].intra_error;
              dVar38 = stats_start[(int)uVar18].coded_error;
              dVar37 = auVar39._0_8_;
              iVar22 = iVar22 + 1;
              auVar39._8_8_ = auVar39._8_8_ + dVar38;
              auVar39._0_8_ = dVar38 * dVar38 + dVar37;
              auVar35._8_8_ = auVar35._8_8_ + dVar43;
              auVar35._0_8_ = dVar43 * dVar43 + dVar34;
            }
          }
          RVar26 = HIGH_VAR_REGION;
          if (0 < iVar22) {
            auVar42._0_8_ = (double)iVar22;
            auVar42._8_8_ = auVar42._0_8_;
            auVar36 = divpd(auVar35,auVar42);
            auVar40 = divpd(auVar39,auVar42);
            dVar43 = auVar36._8_8_;
            dVar38 = auVar40._8_8_;
            if ((1.04 <= auVar40._0_8_ / (dVar38 * dVar38)) ||
               (bVar21 = true, 0.05 <= ABS(local_88[uVar13]) / dVar38)) {
              bVar21 = dVar38 / dVar43 < 0.05;
            }
            RVar26 = (byte)(dVar43 * 0.5 <= dVar38 | ~bVar21 |
                           1.03 <= auVar36._0_8_ / (dVar43 * dVar43)) & HIGH_VAR_REGION;
          }
          pRVar11 = &regions_01[iVar8].type;
          if (regions_01[iVar8].start == iVar12) {
LAB_001e45d8:
            *pRVar11 = RVar26;
          }
          else if (RVar26 != *pRVar11) {
            regions_01[iVar8].last = iVar12 + -1;
            iVar8 = iVar8 + 1;
            regions_01[iVar8].start = iVar12;
            pRVar11 = &regions_01[iVar8].type;
            goto LAB_001e45d8;
          }
        }
        regions_01[iVar8].last = uVar15;
        num_regions = iVar8 + 1;
        remove_short_regions(regions_01,&num_regions,STABLE_REGION,3);
        remove_short_regions(regions_01,&num_regions,HIGH_VAR_REGION,3);
        iVar8 = num_regions;
        lVar29 = (long)num_regions;
        get_region_stats(stats_start,regions_01,num_regions);
        uVar13 = 0;
        if (0 < iVar8) {
          uVar13 = (ulong)(uint)iVar8;
        }
        for (uVar23 = 0; uVar23 != uVar13; uVar23 = uVar23 + 1) {
          if (regions_01[uVar23].type != STABLE_REGION) {
            if (uVar23 != 0) {
              iVar8 = regions_01[uVar23 - 1].last;
              lVar31 = (long)iVar8;
              iVar25 = regions_01[uVar23 - 1].start + 1;
              if (iVar25 < iVar8 + -6) {
                iVar25 = iVar8 + -6;
              }
              pdVar24 = local_58 + (long)iVar25 * 0x1d;
              dVar38 = 0.0;
              dVar43 = 0.0;
              for (lVar27 = 0; iVar25 + lVar27 <= lVar31; lVar27 = lVar27 + 1) {
                dVar43 = dVar43 + *pdVar24;
                dVar38 = dVar38 + 1.0;
                pdVar24 = pdVar24 + 0x1d;
              }
              if ((int)lVar27 != 0) {
                dVar43 = dVar43 / dVar38;
                if (dVar43 <= 0.001) {
                  dVar43 = 0.001;
                }
                iVar25 = regions_01[uVar23].last;
                iVar8 = iVar8 + 2;
                pdVar24 = local_40 + lVar31 * 0x1d;
                iVar22 = 0;
                while (((lVar31 < iVar25 && (ABS(*pdVar24 - dVar43) / dVar43 < 0.1)) &&
                       (iVar22 = iVar22 - (uint)(pdVar24[0x18] <= 0.995 ||
                                                0.1 <= pdVar24[2] / dVar43), -1 < iVar22))) {
                  (regions_01 + uVar23)[-1].last = iVar8 + -1;
                  regions_01[uVar23].start = iVar8;
                  iVar8 = iVar8 + 1;
                  pdVar24 = pdVar24 + 0x1d;
                  lVar31 = lVar31 + 1;
                }
              }
            }
            if ((long)uVar23 < lVar29 + -1) {
              iVar8 = regions_01[uVar23 + 1].start;
              lVar31 = (long)iVar8;
              iVar25 = regions_01[uVar23 + 1].last + -1;
              if (iVar8 + 6 < regions_01[uVar23 + 1].last) {
                iVar25 = iVar8 + 6;
              }
              pdVar10 = local_58 + lVar31 * 0x1d;
              dVar43 = 0.0;
              dVar38 = 0.0;
              for (lVar27 = 0; lVar31 + lVar27 <= (long)iVar25; lVar27 = lVar27 + 1) {
                dVar43 = dVar43 + *pdVar10;
                dVar38 = dVar38 + 1.0;
                pdVar10 = pdVar10 + 0x1d;
              }
              pdVar10 = local_98;
              if ((int)lVar27 != 0) {
                dVar43 = dVar43 / dVar38;
                if (dVar43 <= 0.001) {
                  dVar43 = 0.001;
                }
                iVar8 = iVar8 + -2;
                pdVar24 = local_60 + lVar31 * 0x1d;
                iVar25 = 1;
                while (((regions_01[uVar23].start < lVar31 &&
                        (ABS(pdVar24[-0x1f] - dVar43) / dVar43 < 0.1)) &&
                       (iVar25 = iVar25 - (uint)(pdVar24[-7] <= 0.995 || 0.1 <= *pdVar24 / dVar43),
                       -1 < iVar25))) {
                  (regions_01 + uVar23)[1].start = iVar8 + 1;
                  regions_01[uVar23].last = iVar8;
                  iVar8 = iVar8 + -1;
                  pdVar24 = pdVar24 + -0x1d;
                  lVar31 = lVar31 + -1;
                }
              }
            }
          }
        }
        cleanup_regions(regions_01,&num_regions);
        remove_short_regions(regions_01,&num_regions,HIGH_VAR_REGION,3);
        iVar8 = num_regions;
        get_region_stats(stats_start,regions_01,num_regions);
        local_c4 = 0;
        uVar30 = 0;
        while (((int)uVar30 < iVar8 && (1 < iVar8))) {
          pRVar14 = regions_01 + (int)uVar30;
          if (regions_01[(int)uVar30].type == HIGH_VAR_REGION) {
            if (((((0 < (int)uVar30) && (pRVar14->last - pRVar14->start < 0xd)) &&
                 ((pRVar14->avg_coded_err < regions_01[(ulong)uVar30 - 1].avg_coded_err * 0.99 ||
                  (regions_01[(ulong)uVar30 - 1].avg_cor_coeff * 1.001 < pRVar14->avg_cor_coeff))))
                && (uVar30 < iVar8 - 1U)) &&
               ((pRVar14->avg_coded_err < pRVar14[1].avg_coded_err * 0.99 ||
                (pRVar14[1].avg_cor_coeff * 1.001 < pRVar14->avg_cor_coeff)))) goto LAB_001e4a33;
LAB_001e4a5c:
            uVar30 = uVar30 + 1;
            iVar8 = num_regions;
            local_c4 = uVar30;
          }
          else {
            if ((((regions_01[(int)uVar30].type != STABLE_REGION) ||
                 (((int)uVar30 < 1 || (0xc < pRVar14->last - pRVar14->start)))) ||
                ((pRVar14->avg_coded_err <= regions_01[(ulong)uVar30 - 1].avg_coded_err * 1.01 &&
                 (dVar43 = regions_01[(ulong)uVar30 - 1].avg_cor_coeff * 0.999,
                 dVar43 < pRVar14->avg_cor_coeff || dVar43 == pRVar14->avg_cor_coeff)))) ||
               ((iVar8 - 1U <= uVar30 ||
                ((pRVar14->avg_coded_err <= pRVar14[1].avg_coded_err * 1.01 &&
                 (dVar43 = pRVar14[1].avg_cor_coeff * 0.999,
                 dVar43 < pRVar14->avg_cor_coeff || dVar43 == pRVar14->avg_cor_coeff))))))
            goto LAB_001e4a5c;
LAB_001e4a33:
            remove_region(2,regions_01,&num_regions,(int *)&local_c4);
            uVar30 = local_c4;
            analyze_region(stats_start,local_c4 - 1,regions_01);
            iVar8 = num_regions;
          }
        }
        remove_short_regions(regions_01,&num_regions,STABLE_REGION,7);
        remove_short_regions(regions_01,&num_regions,HIGH_VAR_REGION,3);
        uVar30 = num_regions;
        get_region_stats(stats_start,regions_01,num_regions);
        local_c4 = 0;
        local_90 = 0;
        while ((int)local_c4 < (int)uVar30) {
          if (regions_01[(int)local_c4].type == STABLE_REGION) {
            local_c4 = local_c4 + 1;
            local_90 = local_90 + 1;
          }
          else {
            uVar23 = (ulong)regions_01[(int)local_c4].start;
            piVar28 = local_50 + uVar23 * 0x1d;
            uVar13 = 0;
            iVar8 = 0;
            uVar30 = local_c4;
            uVar18 = local_c4;
            uVar15 = local_c4;
            while( true ) {
              pdVar10 = local_98;
              if ((long)regions_01[(int)uVar15].last < (long)uVar23) break;
              iVar25 = (int)uVar23;
              if ((uVar15 == 0) && (iVar25 == regions_01[(int)uVar15].start)) {
                uVar15 = 0;
              }
              else if ((*piVar28 == 0) && (((long)uVar23 < 1 || (piVar28[-0x1d] == 0)))) {
                dVar43 = (double)piVar28[-0x16];
                dVar38 = dVar43 - (double)piVar28[-0x33];
                if (dVar43 <= 0.01) {
                  dVar43 = 0.01;
                }
                iVar22 = ((0.0 < dVar38) - 1) + (uint)(0.0 < dVar38);
                if (ABS(dVar38) / dVar43 <= 0.05) {
                  iVar22 = 0;
                }
                if (iVar8 != iVar22) {
                  uVar15 = uVar18;
                  if (iVar8 != 0) {
                    insert_region((int)uVar13,iVar25 + -1,BLENDING_REGION,regions_01,&num_regions,
                                  (int *)&local_c4);
                    uVar30 = local_c4;
                    uVar15 = local_c4;
                  }
                  iVar8 = iVar22;
                  if ((uVar15 == 0) && (iVar25 == regions_01->start + 1)) {
                    uVar13 = (ulong)(iVar25 - 1);
                    uVar15 = 0;
                    uVar18 = 0;
                  }
                  else {
                    uVar13 = uVar23 & 0xffffffff;
                    uVar18 = uVar15;
                  }
                }
              }
              uVar23 = uVar23 + 1;
              piVar28 = piVar28 + 0x1d;
            }
            if (iVar8 != 0) {
              insert_region((int)uVar13,regions_01[(int)uVar15].last,BLENDING_REGION,regions_01,
                            &num_regions,(int *)&local_c4);
              uVar30 = local_c4;
            }
            local_c4 = uVar30 + 1;
            pdVar9 = local_70;
            uVar30 = num_regions;
          }
        }
        get_region_stats(stats_start,regions_01,uVar30);
        uVar13 = 0;
        if (0 < (int)uVar30) {
          uVar13 = (ulong)uVar30;
        }
        for (lVar29 = 0; uVar13 * 0x38 - lVar29 != 0; lVar29 = lVar29 + 0x38) {
          if ((*(int *)((long)&regions_01->type + lVar29) == 3) &&
             ((*(int *)((long)&regions_01->last + lVar29) ==
               *(int *)((long)&regions_01->start + lVar29) ||
              (pdVar24 = (double *)((long)&regions_01->avg_cor_coeff + lVar29),
              *pdVar24 <= 0.6 && *pdVar24 != 0.6 || local_90 == 0)))) {
            *(undefined4 *)((long)&regions_01->type + lVar29) = 1;
          }
        }
        get_region_stats(stats_start,regions_01,uVar30);
        local_c4 = 1;
        uVar18 = 1;
        while ((int)uVar18 < (int)uVar30) {
          if ((((((int)(uVar30 - 1) <= (int)uVar18) ||
                (regions_01[(int)uVar18].type != HIGH_VAR_REGION)) ||
               (pRVar14 = regions_01 + (int)uVar18, pRVar14[-1].type != BLENDING_REGION)) ||
              ((pRVar14[1].type != BLENDING_REGION || (2 < pRVar14->last - pRVar14->start)))) ||
             ((local_78[(long)pRVar14[-1].last * 0x1d] <= stats_start[pRVar14[-1].last].intra_error
               && stats_start[pRVar14[-1].last].intra_error !=
                  local_78[(long)pRVar14[-1].last * 0x1d] ||
              (stats_start[pRVar14[1].last].intra_error < local_78[(long)pRVar14[1].last * 0x1d] ||
               stats_start[pRVar14[1].last].intra_error == local_78[(long)pRVar14[1].last * 0x1d])))
             ) {
LAB_001e4d77:
            if ((regions_01[(long)(int)uVar18 + -1].type == BLENDING_REGION) &&
               (regions_01[(int)uVar18].type == BLENDING_REGION)) {
              iVar8 = regions_01[(int)uVar18].last;
              if (iVar8 - regions_01[(long)(int)uVar18 + -1].start < 3) {
                regions_01[(long)(int)uVar18 + -1].type = HIGH_VAR_REGION;
              }
              else {
                iVar25 = regions_01[(long)(int)uVar18 + -1].last;
                if ((stats_start[iVar25].intra_error < stats_start[(long)iVar25 + -1].intra_error ||
                     stats_start[iVar25].intra_error == stats_start[(long)iVar25 + -1].intra_error)
                   && (local_78[(long)iVar8 * 0x1d] <= stats_start[iVar8].intra_error &&
                       stats_start[iVar8].intra_error != local_78[(long)iVar8 * 0x1d])) {
                  iVar8 = iVar25 - regions_01[(long)(int)uVar18 + -1].start;
                  if (iVar8 < 2) {
                    dVar43 = stats_start[iVar25].coded_error;
                    if (stats_start[iVar25].coded_error <=
                        stats_start[(long)iVar25 + -1].coded_error) {
                      dVar43 = stats_start[(long)iVar25 + -1].coded_error;
                    }
                    if (dVar43 <= 0.001) {
                      dVar43 = 0.001;
                    }
                    dVar43 = stats_start[iVar25].sr_coded_error / dVar43;
                    dVar38 = regions_01[(int)uVar18].avg_sr_fr_ratio;
                  }
                  else {
                    dVar43 = stats_start[iVar25].coded_error;
                    if (stats_start[iVar25].coded_error <=
                        stats_start[(long)iVar25 + -1].coded_error) {
                      dVar43 = stats_start[(long)iVar25 + -1].coded_error;
                    }
                    if (dVar43 <= 0.001) {
                      dVar43 = 0.001;
                    }
                    dVar43 = stats_start[iVar25].sr_coded_error / dVar43;
                    dVar38 = ((double)(iVar8 + 1) *
                              regions_01[(long)(int)uVar18 + -1].avg_sr_fr_ratio - dVar43) /
                             (double)iVar8;
                    if (regions_01[(int)uVar18].avg_sr_fr_ratio <= dVar38) {
                      dVar38 = regions_01[(int)uVar18].avg_sr_fr_ratio;
                    }
                  }
                  if (dVar38 * 0.95 < dVar43) {
                    iVar8 = 0;
                    goto LAB_001e4ed0;
                  }
                }
                local_8c = uVar18 - 1;
                insert_region(iVar25,iVar25,HIGH_VAR_REGION,regions_01,&num_regions,&local_8c);
                iVar8 = local_8c;
                analyze_region(stats_start,local_8c,regions_01);
                uVar18 = iVar8 + 1;
                analyze_region(stats_start,uVar18,regions_01);
              }
            }
            local_c4 = uVar18 + 1;
            uVar30 = num_regions;
            uVar18 = local_c4;
          }
          else {
            dVar43 = pRVar14[-1].avg_sr_fr_ratio;
            if (pRVar14[1].avg_sr_fr_ratio <= pRVar14[-1].avg_sr_fr_ratio) {
              dVar43 = pRVar14[1].avg_sr_fr_ratio;
            }
            if (pRVar14->avg_sr_fr_ratio <= dVar43 * 0.95) goto LAB_001e4d77;
            pRVar14->type = BLENDING_REGION;
            iVar8 = 2;
LAB_001e4ed0:
            remove_region(iVar8,regions_01,&num_regions,(int *)&local_c4);
            uVar18 = local_c4;
            analyze_region(stats_start,local_c4 - 1,regions_01);
            uVar30 = num_regions;
          }
        }
        cleanup_regions(regions_01,&num_regions);
        pRVar11 = local_48;
        local_c4 = 0;
LAB_001e4f16:
        dVar43 = 1.0;
        while (((int)local_c4 < num_regions && (1 < num_regions))) {
          lVar29 = (long)(int)local_c4;
          pRVar14 = regions_01 + lVar29;
          if (regions_01[lVar29].type == HIGH_VAR_REGION) {
            bVar21 = 3 < pRVar14->last - pRVar14->start;
LAB_001e4f6e:
            bVar4 = false;
          }
          else {
            bVar21 = true;
            if (regions_01[lVar29].type != BLENDING_REGION) goto LAB_001e4f6e;
            bVar4 = pRVar14->last - pRVar14->start < 4;
          }
          uVar13 = (ulong)local_c4;
          if (((int)local_c4 < 1) || (pRVar11[uVar13 * 0xe] != STABLE_REGION)) {
            bVar32 = false;
            if ((num_regions + -1 <= (int)local_c4) ||
               (bVar32 = pRVar14[1].type == STABLE_REGION, 0 < (int)local_c4)) goto LAB_001e4fa3;
LAB_001e4fb2:
            bVar33 = false;
            if ((int)local_c4 < num_regions + -1) {
              bVar33 = pRVar14[1].type == BLENDING_REGION;
            }
          }
          else {
            bVar32 = true;
LAB_001e4fa3:
            bVar33 = true;
            if (pRVar11[uVar13 * 0xe] != BLENDING_REGION) goto LAB_001e4fb2;
          }
          if ((bVar4) ||
             (!bVar21 &&
              (byte)(((int)local_c4 < num_regions + -1) + (0 < (int)local_c4)) <=
              (byte)(bVar33 + bVar32))) goto LAB_001e4ff7;
          local_c4 = local_c4 + 1;
        }
        cleanup_regions(regions_01,&num_regions);
        for (local_a4 = 0; local_a4 < num_regions; local_a4 = local_a4 + 1) {
          if (regions_01[local_a4].type == STABLE_REGION) {
            lVar29 = (long)regions_01[local_a4].start;
            iVar8 = regions_01[local_a4].last;
            piVar28 = local_50 + lVar29 * 0x1d;
            for (; pdVar10 = local_98, pdVar9 = local_70, lVar29 <= iVar8; lVar29 = lVar29 + 1) {
              if (*piVar28 != 0) {
                insert_region((int)lVar29,(int)lVar29,HIGH_VAR_REGION,regions_01,&num_regions,
                              &local_a4);
              }
              piVar28 = piVar28 + 0x1d;
            }
          }
        }
        cleanup_regions(regions_01,&num_regions);
        num_regions_00 = local_80;
        pRVar14 = local_a0;
        uVar30 = num_regions - 1;
        uVar13 = 0;
        if (0 < num_regions) {
          uVar13 = (ulong)(uint)num_regions;
        }
        for (lVar29 = 0;
            (uVar23 = uVar13, uVar18 = num_regions, uVar13 * 0x38 - lVar29 != 0 &&
            ((*(int *)((long)&regions_01->start + lVar29) <=
              *(int *)((long)&regions_01->last + lVar29) ||
             (uVar23 = (ulong)uVar30, uVar18 = uVar30, (ulong)uVar30 * 0x38 - lVar29 != 0))));
            lVar29 = lVar29 + 0x38) {
          puVar1 = (undefined8 *)((long)&regions_01->start + lVar29);
          *(undefined8 *)((long)&local_a0[local_a8].type + lVar29) = puVar1[6];
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          auVar36 = *(undefined1 (*) [16])(puVar1 + 2);
          *(undefined1 (*) [16])((long)&local_a0[local_a8].avg_intra_err + lVar29) =
               *(undefined1 (*) [16])(puVar1 + 4);
          *(undefined1 (*) [16])((long)&local_a0[local_a8].avg_cor_coeff + lVar29) = auVar36;
          puVar1 = (undefined8 *)((long)&local_a0[local_a8].start + lVar29);
          *puVar1 = uVar5;
          puVar1[1] = uVar6;
        }
        iVar8 = uVar18 + local_a8;
        local_a4 = (int)uVar23;
        iVar25 = (int)local_c0;
        if (iVar25 < 0) {
          *local_80 = iVar8;
          get_region_stats(stats_start,local_a0,iVar8);
          pdVar10 = local_98;
          regions_00 = local_a0;
          pRVar11 = &pRVar14->type;
          for (lVar29 = 0; lVar29 < *num_regions_00; lVar29 = lVar29 + 1) {
            if ((*pRVar11 == SCENECUT_REGION) &&
               (0.8 <= (1.0 - stats_start[((REGIONS *)(pRVar11 + -0xc))->start].noise_var /
                              *(double *)(pRVar11 + -4)) * *(double *)(pRVar11 + -8))) {
              *pRVar11 = HIGH_VAR_REGION;
            }
            pRVar11 = pRVar11 + 0xe;
          }
          cleanup_regions(local_a0,num_regions_00);
          get_region_stats(stats_start,regions_00,*local_80);
          for (lVar29 = 0; lVar29 < *local_80; lVar29 = lVar29 + 1) {
            uVar2 = local_a0->start;
            uVar3 = local_a0->last;
            local_a0->start = uVar2 + local_64;
            local_a0->last = uVar3 + local_64;
            local_a0 = local_a0 + 1;
          }
          free_firstpass_stats_buffers(regions_01,pdVar9,pdVar10,local_88);
          return 0;
        }
        local_a0[iVar8].type = SCENECUT_REGION;
        local_a0[iVar8].start = iVar25;
        local_a0[iVar8].last = iVar25;
        local_a8 = iVar8 + 1;
        uVar30 = iVar25 + 1;
      } while( true );
    }
    iVar8 = -1;
    free_firstpass_stats_buffers(regions_01,pdVar9,pdVar10,local_88);
  }
  return iVar8;
LAB_001e4ff7:
  dVar38 = 1.0;
  if (0 < (int)local_c4) {
    dVar38 = (double)((ulong)(regions_01[uVar13].avg_cor_coeff - local_38[uVar13 * 7]) &
                     (ulong)DAT_0042d090);
  }
  if ((int)local_c4 < num_regions + -1) {
    dVar43 = (double)((ulong)(regions_01[lVar29].avg_cor_coeff - pRVar14[1].avg_cor_coeff) &
                     (ulong)DAT_0042d090);
  }
  remove_region((uint)(dVar43 < dVar38),regions_01,&num_regions,(int *)&local_c4);
  goto LAB_001e4f16;
}

Assistant:

static int identify_regions(const FIRSTPASS_STATS *const stats_start,
                            int total_frames, int offset, REGIONS *regions,
                            int *total_regions) {
  int k;
  if (total_frames <= 1) return 0;

  // store the initial decisions
  REGIONS *temp_regions =
      (REGIONS *)aom_malloc(total_frames * sizeof(temp_regions[0]));
  // buffers for filtered stats
  double *filt_intra_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_intra_err));
  double *filt_coded_err =
      (double *)aom_calloc(total_frames, sizeof(*filt_coded_err));
  double *grad_coded = (double *)aom_calloc(total_frames, sizeof(*grad_coded));
  if (!(temp_regions && filt_intra_err && filt_coded_err && grad_coded)) {
    free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                                 grad_coded);
    return -1;
  }
  av1_zero_array(temp_regions, total_frames);

  int cur_region = 0, this_start = 0, this_last;

  int next_scenecut = -1;
  do {
    // first get the obvious scenecuts
    next_scenecut =
        find_next_scenecut(stats_start, this_start, total_frames - 1);
    this_last = (next_scenecut >= 0) ? (next_scenecut - 1) : total_frames - 1;

    // low-pass filter the needed stats
    smooth_filter_stats(stats_start, this_start, this_last, filt_intra_err,
                        filt_coded_err);
    get_gradient(filt_coded_err, this_start, this_last, grad_coded);

    // find tentative stable regions and unstable regions
    int num_regions = find_stable_regions(stats_start, grad_coded, this_start,
                                          this_last, temp_regions);

    adjust_unstable_region_bounds(stats_start, temp_regions, &num_regions);

    get_region_stats(stats_start, temp_regions, num_regions);

    // Try to identify blending regions in the unstable regions
    find_blending_regions(stats_start, temp_regions, &num_regions);
    cleanup_blendings(temp_regions, &num_regions);

    // The flash points should all be considered high variance points
    k = 0;
    while (k < num_regions) {
      if (temp_regions[k].type != STABLE_REGION) {
        k++;
        continue;
      }
      int start = temp_regions[k].start;
      int last = temp_regions[k].last;
      for (int i = start; i <= last; i++) {
        if (stats_start[i].is_flash) {
          insert_region(i, i, HIGH_VAR_REGION, temp_regions, &num_regions, &k);
        }
      }
      k++;
    }
    cleanup_regions(temp_regions, &num_regions);

    // copy the regions in the scenecut group
    for (k = 0; k < num_regions; k++) {
      if (temp_regions[k].last < temp_regions[k].start &&
          k == num_regions - 1) {
        num_regions--;
        break;
      }
      regions[k + cur_region] = temp_regions[k];
    }
    cur_region += num_regions;

    // add the scenecut region
    if (next_scenecut > -1) {
      // add the scenecut region, and find the next scenecut
      regions[cur_region].type = SCENECUT_REGION;
      regions[cur_region].start = next_scenecut;
      regions[cur_region].last = next_scenecut;
      cur_region++;
      this_start = next_scenecut + 1;
    }
  } while (next_scenecut >= 0);

  *total_regions = cur_region;
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    // If scenecuts are very minor, mark them as high variance.
    if (regions[k].type != SCENECUT_REGION ||
        regions[k].avg_cor_coeff *
                (1 - stats_start[regions[k].start].noise_var /
                         regions[k].avg_intra_err) <
            0.8) {
      continue;
    }
    regions[k].type = HIGH_VAR_REGION;
  }
  cleanup_regions(regions, total_regions);
  get_region_stats(stats_start, regions, *total_regions);

  for (k = 0; k < *total_regions; k++) {
    regions[k].start += offset;
    regions[k].last += offset;
  }

  free_firstpass_stats_buffers(temp_regions, filt_intra_err, filt_coded_err,
                               grad_coded);
  return 0;
}